

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
GrcManager::CmapAndInverse
          (GrcManager *this,GrcFont *pfont,int cnUni,utf16 *rgchwUniToGlyphID,uint *rgnGlyphIDToUni,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *vnXUniForPsd,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *vwXPsdForUni)

{
  iterator __position;
  iterator __position_00;
  bool bVar1;
  pointer puVar2;
  ulong uVar3;
  int iVar4;
  uint *__args;
  unsigned_short *__args_00;
  long lVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  
  iVar11 = 0;
  memset(rgchwUniToGlyphID,0,(long)cnUni * 2);
  memset(rgnGlyphIDToUni,0,0x40000);
  GrcFont::GetGlyphsFromCmap(pfont,rgchwUniToGlyphID);
  uVar9 = *(pfont->m_vnMinUnicode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (uVar9 != 0xffffffff) {
    lVar7 = 0;
    uVar10 = 0;
    uVar3 = (ulong)uVar9;
    do {
      puVar2 = (this->m_vnUnicodeForPseudo).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar4 = (int)((ulong)((long)(this->m_vnUnicodeForPseudo).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >> 2);
      bVar1 = iVar11 < iVar4;
      uVar9 = (uint)uVar3;
      if (iVar11 < iVar4) {
        lVar12 = (long)iVar11;
        uVar8 = puVar2[lVar12];
        if (uVar8 < uVar9) {
          __args = puVar2 + lVar12;
          lVar6 = lVar12 * 2;
          lVar13 = lVar12;
          do {
            iVar11 = iVar11 + 1;
            __position._M_current =
                 (vnXUniForPsd->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (vnXUniForPsd->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)vnXUniForPsd,
                         __position,__args);
            }
            else {
              *__position._M_current = uVar8;
              (vnXUniForPsd->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
              _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            __args_00 = (unsigned_short *)
                        ((long)(this->m_vwPseudoForUnicode).
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar6);
            __position_00._M_current =
                 (vwXPsdForUni->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position_00._M_current ==
                (vwXPsdForUni->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_short,std::allocator<unsigned_short>>::
              _M_realloc_insert<unsigned_short_const&>
                        ((vector<unsigned_short,std::allocator<unsigned_short>> *)vwXPsdForUni,
                         __position_00,__args_00);
            }
            else {
              *__position_00._M_current = *__args_00;
              (vwXPsdForUni->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
              _M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
            }
            lVar12 = lVar13 + 1;
            puVar2 = (this->m_vnUnicodeForPseudo).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar5 = (long)(int)((ulong)((long)(this->m_vnUnicodeForPseudo).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)puVar2) >> 2);
            bVar1 = lVar12 < lVar5;
            if (lVar5 <= lVar12) goto LAB_001181c0;
            __args = puVar2 + lVar12;
            uVar8 = puVar2[lVar13 + 1];
            lVar6 = lVar6 + 2;
            lVar13 = lVar12;
          } while (uVar8 < uVar9);
        }
        iVar11 = (int)lVar12;
        if ((bVar1) && (puVar2[iVar11] == uVar9)) {
          rgchwUniToGlyphID[lVar7] =
               (this->m_vwPseudoForUnicode).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start[iVar11];
          iVar11 = iVar11 + 1;
        }
      }
LAB_001181c0:
      rgnGlyphIDToUni[rgchwUniToGlyphID[lVar7]] = uVar9;
      if (uVar9 + 1 <
          (pfont->m_vnLimUnicode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar10 >> 0x20]) {
        uVar10 = (ulong)(uVar9 + 1) | uVar10 & 0xffffffff00000000;
      }
      else {
        uVar3 = (uVar10 >> 0x20) + 1;
        uVar10 = uVar3 & 0xffffffff;
        puVar2 = (pfont->m_vnMinUnicode).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (uVar10 < (ulong)((long)(pfont->m_vnMinUnicode).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2)) {
          uVar10 = (ulong)puVar2[uVar10];
        }
        else {
          uVar10 = 0xffffffff;
        }
        uVar10 = uVar3 << 0x20 | uVar10;
      }
      lVar7 = lVar7 + 1;
      uVar3 = uVar10;
    } while ((int)uVar10 != -1);
  }
  return;
}

Assistant:

void GrcManager::CmapAndInverse(GrcFont * pfont, 
	int cnUni, utf16 * rgchwUniToGlyphID, unsigned int * rgnGlyphIDToUni,
	std::vector<unsigned int> & vnXUniForPsd, std::vector<utf16> & vwXPsdForUni)
{
	memset(rgchwUniToGlyphID, 0, (cnUni * sizeof(utf16)));
	memset(rgnGlyphIDToUni, 0, (0x10000 * sizeof(int)));

	pfont->GetGlyphsFromCmap(rgchwUniToGlyphID);

	// Generate the inverse cmap. Also overwrite the glyph IDs for any pseudos.
	int iUni;
	GrcFont::iterator fit(pfont);
	int iUniPsd = 0;
	for (iUni = 0, fit = pfont->Begin();
		fit != pfont->End();
		++fit, ++iUni)
	{
		unsigned int nUni = *fit;

		// Handle pseudos.
		while (iUniPsd < signed(m_vnUnicodeForPseudo.size()) && nUni > m_vnUnicodeForPseudo[iUniPsd])
		{
			// Put any Unicode -> pseudo mappings where the Unicode is not in the cmap into 
			// a separate list.
			vnXUniForPsd.push_back(m_vnUnicodeForPseudo[iUniPsd]);
			vwXPsdForUni.push_back(m_vwPseudoForUnicode[iUniPsd]);
			iUniPsd++;
		}
		if (iUniPsd < signed(m_vnUnicodeForPseudo.size()) && m_vnUnicodeForPseudo[iUniPsd] == nUni)
		{
			// Pseudo: overwrite glyph ID.
			rgchwUniToGlyphID[iUni] = m_vwPseudoForUnicode[iUniPsd];
			iUniPsd++;
		}
		utf16 wGlyph = rgchwUniToGlyphID[iUni];
		rgnGlyphIDToUni[wGlyph] = nUni;
	}
	Assert(iUni == cnUni);
}